

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Native_File_Chooser_FLTK.cxx
# Opt level: O1

int __thiscall Fl_FLTK_File_Chooser::show(Fl_FLTK_File_Chooser *this)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  Fl_File_Chooser *pFVar4;
  stat buf;
  stat64 local_a0;
  
  if (this->_parsedfilt != (char *)0x0) {
    Fl_File_Chooser::filter(this->_file_chooser,this->_parsedfilt);
  }
  Fl_File_Chooser::filter_value(this->_file_chooser,this->_filtvalue);
  pcVar3 = this->_directory;
  if ((pcVar3 == (char *)0x0) || (*pcVar3 == '\0')) {
    pcVar3 = this->_prevvalue;
  }
  Fl_File_Chooser::directory(this->_file_chooser,pcVar3);
  if (this->_preset_file != (char *)0x0) {
    Fl_File_Chooser::value(this->_file_chooser,this->_preset_file);
  }
  Fl_File_Chooser::preview(this->_file_chooser,(uint)this->_options >> 2 & 1);
  if ((this->_options & 2) != 0) {
    pFVar4 = this->_file_chooser;
    uVar1 = Fl_File_Chooser::type(pFVar4);
    Fl_File_Chooser::type(pFVar4,uVar1 | 2);
  }
  Fl_File_Chooser::show(this->_file_chooser);
  while( true ) {
    pFVar4 = this->_file_chooser;
    iVar2 = Fl_File_Chooser::shown(pFVar4);
    if (iVar2 == 0) break;
    Fl::wait(pFVar4);
  }
  pcVar3 = Fl_File_Chooser::value(this->_file_chooser,1);
  if ((pcVar3 != (char *)0x0) &&
     (pcVar3 = Fl_File_Chooser::value(this->_file_chooser,1), *pcVar3 != '\0')) {
    if (this->_prevvalue != (char *)0x0) {
      operator_delete__(this->_prevvalue);
    }
    this->_prevvalue = (char *)0x0;
    pcVar3 = Fl_File_Chooser::value(this->_file_chooser,1);
    pcVar3 = strnew(pcVar3);
    this->_prevvalue = pcVar3;
    iVar2 = Fl_File_Chooser::filter_value(this->_file_chooser);
    this->_filtvalue = iVar2;
    if (((this->_options & 1) != 0) && (this->_btype == 4)) {
      pcVar3 = Fl_File_Chooser::value(this->_file_chooser,1);
      iVar2 = stat64(pcVar3,&local_a0);
      if ((iVar2 != -1) &&
         (((local_a0.st_mode._1_1_ & 0x80) != 0 &&
          (iVar2 = fl_choice("%s",fl_cancel,fl_ok,(char *)0x0,
                             Fl_Native_File_Chooser::file_exists_message), iVar2 == 0)))) {
        return 1;
      }
    }
  }
  iVar2 = Fl_File_Chooser::count(this->_file_chooser);
  return (uint)(iVar2 == 0);
}

Assistant:

int Fl_FLTK_File_Chooser::show() {

  // FILTER
  if ( _parsedfilt ) {
    _file_chooser->filter(_parsedfilt);
  }

  // FILTER VALUE
  //     Set this /after/ setting the filter
  //
  _file_chooser->filter_value(_filtvalue);

  // DIRECTORY
  if ( _directory && _directory[0] ) {
    _file_chooser->directory(_directory);
  } else {
    _file_chooser->directory(_prevvalue);
  }

  // PRESET FILE
  if ( _preset_file ) {
    _file_chooser->value(_preset_file);
  }

  // OPTIONS: PREVIEW
  _file_chooser->preview( (options() & Fl_Native_File_Chooser::PREVIEW) ? 1 : 0);

  // OPTIONS: NEW FOLDER
  if ( options() & Fl_Native_File_Chooser::NEW_FOLDER )
    _file_chooser->type(_file_chooser->type() | Fl_File_Chooser::CREATE);	// on
  
  // SHOW
  _file_chooser->show();

  // BLOCK WHILE BROWSER SHOWN
  while ( _file_chooser->shown() ) {
    Fl::wait();
  }

  if ( _file_chooser->value() && _file_chooser->value()[0] ) {
    _prevvalue = strfree(_prevvalue);
    _prevvalue = strnew(_file_chooser->value());
    _filtvalue = _file_chooser->filter_value(); // update filter value

    // HANDLE SHOWING 'SaveAs' CONFIRM
    if ( options() & Fl_Native_File_Chooser::SAVEAS_CONFIRM && type() == Fl_Native_File_Chooser::BROWSE_SAVE_FILE ) {
      struct stat buf;
      if ( stat(_file_chooser->value(), &buf) != -1 ) {
        if ( buf.st_mode & S_IFREG ) {    // Regular file + exists?
          if ( exist_dialog() == 0 ) {
            return(1);
          }
        }
      }
    }
  }

  if ( _file_chooser->count() ) return(0);
  else return(1);
}